

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snedecor_f_dist.hpp
# Opt level: O2

result_type_conflict3 * __thiscall
trng::snedecor_f_dist<long_double>::cdf
          (result_type_conflict3 *__return_storage_ptr__,snedecor_f_dist<long_double> *this,
          result_type_conflict3 x)

{
  result_type_conflict3 *prVar1;
  longdouble lVar2;
  
  lVar2 = x._0_10_ * (longdouble)*(int *)__return_storage_ptr__;
  prVar1 = (result_type_conflict3 *)
           math::Beta_I((longdouble *)__return_storage_ptr__,
                        lVar2 / (lVar2 + (longdouble)*(int *)((long)__return_storage_ptr__ + 4)),
                        (longdouble)*(int *)__return_storage_ptr__ * (longdouble)0.5,
                        (longdouble)0.5 * (longdouble)*(int *)((long)__return_storage_ptr__ + 4));
  return prVar1;
}

Assistant:

cdf(result_type x) const {
      const result_type n{static_cast<result_type>(P.n())};
      const result_type m{static_cast<result_type>(P.m())};
      return math::Beta_I(n * x / (m + n * x), result_type(1) / result_type(2) * n,
                          result_type(1) / result_type(2) * m);
    }